

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubjson_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::ubjson::
basic_ubjson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
::read_type_and_value
          (basic_ubjson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
           *this,json_visitor *visitor,error_code *ec)

{
  bool bVar1;
  type_conflict2 tVar2;
  undefined8 in_RDX;
  error_code *in_RSI;
  long in_RDI;
  uint8_t b;
  error_code *in_stack_000000d8;
  uint8_t in_stack_000000e7;
  json_visitor *in_stack_000000e8;
  basic_ubjson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
  *in_stack_000000f0;
  ubjson_errc __e;
  
  __e = (ubjson_errc)((ulong)in_RDX >> 0x20);
  bVar1 = binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::is_error((binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)(in_RDI + 0x18));
  if (bVar1) {
    std::error_code::operator=(in_RSI,__e);
    *(undefined1 *)(in_RDI + 8) = 0;
  }
  else {
    tVar2 = binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::read<std::random_access_iterator_tag>
                      ((binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)this,(value_type *)visitor,(size_t)ec);
    if (tVar2 == 0) {
      std::error_code::operator=(in_RSI,__e);
      *(undefined1 *)(in_RDI + 8) = 0;
    }
    else {
      read_value(in_stack_000000f0,in_stack_000000e8,in_stack_000000e7,in_stack_000000d8);
    }
  }
  return;
}

Assistant:

void read_type_and_value(json_visitor& visitor, std::error_code& ec)
    {
        if (source_.is_error())
        {
            ec = ubjson_errc::source_error;
            more_ = false;
            return;
        }   

        uint8_t b;
        if (source_.read(&b, 1) == 0)
        {
            ec = ubjson_errc::unexpected_eof;
            more_ = false;
            return;
        }
        read_value(visitor, b, ec);
    }